

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::ExeName::parse(ExeName *this,string *param_2,TokenStream *tokens)

{
  ParseState *in_RCX;
  InternalParseResult *in_RDI;
  InternalParseResult *pIVar1;
  ParseState *this_00;
  ParseState local_78 [2];
  
  this_00 = local_78;
  pIVar1 = in_RDI;
  Detail::TokenStream::TokenStream((TokenStream *)in_RDI,(TokenStream *)in_RCX);
  Detail::ParseState::ParseState
            (this_00,(ParseResultType)((ulong)pIVar1 >> 0x20),(TokenStream *)in_RDI);
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
            (in_RCX);
  Detail::ParseState::~ParseState((ParseState *)0x18718f);
  Detail::TokenStream::~TokenStream((TokenStream *)0x187199);
  return pIVar1;
}

Assistant:

Detail::InternalParseResult
            ExeName::parse(std::string const&,
                           Detail::TokenStream tokens) const {
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, CATCH_MOVE(tokens)));
        }